

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Statements.cpp
# Opt level: O0

bool __thiscall psy::C::Parser::parseExpressionStatement(Parser *this,StatementSyntax **stmt)

{
  bool bVar1;
  SyntaxKind SVar2;
  SyntaxToken *this_00;
  IndexType IVar3;
  ExpressionStatementSyntax *pEVar4;
  ExpressionStatementSyntax *exprStmt;
  ExpressionSyntax *expr;
  ExpressionStatementSyntax *exprStmt_1;
  StatementSyntax **stmt_local;
  Parser *this_local;
  
  exprStmt_1 = (ExpressionStatementSyntax *)stmt;
  stmt_local = (StatementSyntax **)this;
  this_00 = peek(this,1);
  SVar2 = SyntaxToken::kind(this_00);
  if (SVar2 == SemicolonToken) {
    expr = (ExpressionSyntax *)makeNode<psy::C::ExpressionStatementSyntax>(this);
    (exprStmt_1->super_StatementSyntax).super_SyntaxNode.super_Managed._vptr_Managed =
         (_func_int **)expr;
    IVar3 = consume(this);
    (expr->super_MIXIN_GNUExtensionFlag).extKwTkIdx_ = IVar3;
    this_local._7_1_ = true;
  }
  else {
    exprStmt = (ExpressionStatementSyntax *)0x0;
    bVar1 = parseExpression(this,(ExpressionSyntax **)&exprStmt);
    if (bVar1) {
      pEVar4 = makeNode<psy::C::ExpressionStatementSyntax>(this);
      (exprStmt_1->super_StatementSyntax).super_SyntaxNode.super_Managed._vptr_Managed =
           (_func_int **)pEVar4;
      pEVar4->expr_ = (ExpressionSyntax *)exprStmt;
      this_local._7_1_ = matchOrSkipTo(this,SemicolonToken,&pEVar4->semicolonTkIdx_);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::parseExpressionStatement(StatementSyntax*& stmt)
{
    DBG_THIS_RULE();

    if (peek().kind() == SyntaxKind::SemicolonToken) {
        auto exprStmt = makeNode<ExpressionStatementSyntax>();
        stmt = exprStmt;
        exprStmt->semicolonTkIdx_ = consume();
        return true;
    }

    ExpressionSyntax* expr = nullptr;
    if (!parseExpression(expr))
        return false;

    auto exprStmt = makeNode<ExpressionStatementSyntax>();
    stmt = exprStmt;
    exprStmt->expr_ = expr;

    return matchOrSkipTo(SyntaxKind::SemicolonToken, &exprStmt->semicolonTkIdx_);
}